

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Expr * nivalis::parse(Expr *__return_storage_ptr__,string *expr,Environment *env,bool mode_explicit,
                     bool quiet,size_t max_args,string *error_msg)

{
  ParseSession sess;
  allocator_type local_a9;
  Expr *local_a8;
  ParseSession local_a0;
  
  if (expr->_M_string_length == 0) {
    Expr::Expr(__return_storage_ptr__);
  }
  else {
    if (((((error_msg == (string *)0x0) || (error_msg->_M_string_length == 0)) ||
         ((error_msg->_M_dataplus)._M_p[error_msg->_M_string_length - 1] == '\n')) ||
        (local_a8 = (Expr *)max_args, std::__cxx11::string::push_back((char)error_msg),
        max_args = (size_t)local_a8, expr->_M_string_length != 0)) &&
       (*(expr->_M_dataplus)._M_p == '#')) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 &local_a0,1,&local_a9);
      Expr::Expr(__return_storage_ptr__,(AST *)&local_a0);
      local_a0.result.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_a0.env;
      local_a0.result.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_a0.error_msg;
    }
    else {
      local_a0.error_msg = error_msg;
      local_a8 = __return_storage_ptr__;
      local_a0.env = env;
      local_a0.expr = expr;
      Expr::Expr(&local_a0.result);
      __return_storage_ptr__ = local_a8;
      local_a0.thunks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.thunks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.thunks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.mode_explicit = mode_explicit;
      local_a0.quiet = quiet;
      local_a0.max_args = max_args;
      ParseSession::parse(local_a8,&local_a0);
      if (local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.tok_link.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.thunks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.thunks.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.thunks.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.thunks.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((Environment *)
        local_a0.result.ast.
        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
        super__Vector_impl_data._M_start != (Environment *)0x0) {
      operator_delete(local_a0.result.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.result.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.result.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expr parse(const std::string& expr, Environment& env,
        bool mode_explicit, bool quiet, size_t max_args,
       std::string* error_msg) {
    if (expr.empty()) return Expr();
    // If already error, add newline
    if (error_msg && error_msg->size() && error_msg->back() != '\n') error_msg->push_back('\n');
    if (expr.size() && expr[0] == '#') return Expr::AST(1); // Comment
    ParseSession sess(
            expr, env, error_msg, mode_explicit, quiet, max_args);
    return sess.parse();
}